

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilBridge.c
# Opt level: O0

Gia_Man_t * Gia_ManFromBridge(FILE *pFile,Vec_Int_t **pvInit)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *p;
  int local_30;
  int RetValue;
  int Size;
  int Type;
  uchar *pBuffer;
  Vec_Int_t **pvInit_local;
  FILE *pFile_local;
  
  pBuffer = (uchar *)pvInit;
  pvInit_local = (Vec_Int_t **)pFile;
  iVar1 = Gia_ManFromBridgeReadPackage(pFile,&RetValue,&local_30,(uchar **)&Size);
  if (_Size != (uchar *)0x0) {
    free(_Size);
    _Size = (uchar *)0x0;
  }
  if (iVar1 == 0) {
    pFile_local = (FILE *)0x0;
  }
  else {
    iVar1 = Gia_ManFromBridgeReadPackage((FILE *)pvInit_local,&RetValue,&local_30,(uchar **)&Size);
    if (iVar1 == 0) {
      pFile_local = (FILE *)0x0;
    }
    else {
      pGVar2 = Gia_ManFromBridgeReadBody(local_30,_Size,(Vec_Int_t **)pBuffer);
      if (_Size != (uchar *)0x0) {
        free(_Size);
        _Size = (uchar *)0x0;
      }
      if (pGVar2 == (Gia_Man_t *)0x0) {
        pFile_local = (FILE *)0x0;
      }
      else {
        iVar1 = Gia_ManFromBridgeReadPackage
                          ((FILE *)pvInit_local,&RetValue,&local_30,(uchar **)&Size);
        if (_Size != (uchar *)0x0) {
          free(_Size);
        }
        pFile_local = (FILE *)pGVar2;
        if (iVar1 == 0) {
          pFile_local = (FILE *)0x0;
        }
      }
    }
  }
  return (Gia_Man_t *)pFile_local;
}

Assistant:

Gia_Man_t * Gia_ManFromBridge( FILE * pFile, Vec_Int_t ** pvInit )
{
    unsigned char * pBuffer;
    int Type, Size, RetValue;
    Gia_Man_t * p = NULL;

    RetValue = Gia_ManFromBridgeReadPackage( pFile, &Type, &Size, &pBuffer );
    ABC_FREE( pBuffer );
    if ( !RetValue )
        return NULL;

    RetValue = Gia_ManFromBridgeReadPackage( pFile, &Type, &Size, &pBuffer );
    if ( !RetValue )
        return NULL;

    p = Gia_ManFromBridgeReadBody( Size, pBuffer, pvInit );
    ABC_FREE( pBuffer );
    if ( p == NULL )
        return NULL;

    RetValue = Gia_ManFromBridgeReadPackage( pFile, &Type, &Size, &pBuffer );
    ABC_FREE( pBuffer );
    if ( !RetValue )
        return NULL;

    return p;
}